

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O2

void __thiscall ScriptException::~ScriptException(ScriptException *this)

{
  FreeExcepInfo(&this->ei);
  return;
}

Assistant:

ScriptException::~ScriptException(void)
{
    FreeExcepInfo(&ei);
}